

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O1

void __thiscall
FloatingPointType::FloatingPointType(FloatingPointType *this,string *name,TypeKind kind)

{
  pointer pcVar1;
  
  (this->super_Type).kind = kind;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__FloatingPointType_0017f928;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

Type(TypeKind kind): kind(kind) {}